

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O0

void __thiscall indk::Interlink::Interlink(Interlink *this)

{
  Interlink *this_local;
  
  std::__cxx11::string::string((string *)&this->Host);
  std::__cxx11::string::string((string *)&this->InputPort);
  std::__cxx11::string::string((string *)&this->OutputPort);
  std::thread::thread(&this->Thread);
  std::__cxx11::string::string((string *)&this->Structure);
  this->Input = (void *)0x0;
  this->Output = (void *)0x0;
  std::atomic<bool>::store(&this->Interlinked,false,memory_order_seq_cst);
  doInitInput(this,0x1138,5);
  return;
}

Assistant:

indk::Interlink::Interlink() {
    Input = nullptr;
    Output = nullptr;
    Interlinked.store(false);
    doInitInput(4408, 5);
}